

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<unsigned_int,_sptk::uint24_t>::Run
          (DataTransform<unsigned_int,_sptk::uint24_t> *this,istream *input_stream)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  NumericType NVar6;
  WarningType WVar7;
  char *__nptr;
  bool bVar8;
  int *piVar9;
  undefined8 uVar10;
  ostream *poVar11;
  size_t sVar12;
  byte bVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar20;
  uint input_data;
  string word;
  char buffer [128];
  uint24_t local_280;
  uint24_t local_27d;
  ushort local_27a;
  ulong local_278;
  uint local_26c;
  istream *local_268;
  string local_260;
  string *local_240;
  long local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_240 = &this->print_format_;
  local_278 = 0;
  local_268 = input_stream;
  do {
    if (this->is_ascii_input_ == true) {
      local_228 = 0;
      local_220[0] = '\0';
      local_230 = local_220;
      std::operator>>(local_268,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        iVar18 = 2;
        bVar8 = false;
      }
      else {
        piVar9 = __errno_location();
        iVar18 = *piVar9;
        *piVar9 = 0;
        strtold(__nptr,(char **)&local_260);
        if (local_260._M_dataplus._M_p == __nptr) {
          uVar10 = std::__throw_invalid_argument("stold");
LAB_00136cc4:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar10);
        }
        if (*piVar9 == 0) {
          *piVar9 = iVar18;
        }
        else if (*piVar9 == 0x22) {
          uVar10 = std::__throw_out_of_range("stold");
          goto LAB_00136cc4;
        }
        local_27a = in_FPUControlWord | 0xc00;
        local_238 = (long)ROUND(in_ST0);
        local_26c = (uint)local_238;
        iVar18 = 0;
        bVar8 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar8) {
LAB_00136991:
        bVar13 = (byte)(local_26c >> 8);
        bVar14 = (byte)(local_26c >> 0x10);
        bVar1 = (this->minimum_value_).value[2];
        bVar2 = (this->minimum_value_).value[1];
        bVar3 = (this->minimum_value_).value[0];
        uVar17 = (uint)bVar2 << 8 | (uint)bVar1 << 0x10 | (uint)bVar3;
        bVar4 = (this->maximum_value_).value[2];
        bVar5 = (this->maximum_value_).value[1];
        uVar15 = (uint)(this->maximum_value_).value[0];
        uVar16 = (uint)bVar5 << 8 | (uint)bVar4 << 0x10 | uVar15;
        bVar8 = true;
        uVar19 = local_26c;
        if ((uVar17 < uVar16) &&
           (((NVar6 = this->input_numeric_type_, NVar6 == kFloatingPoint ||
             (NVar6 == kUnsignedInteger)) || (NVar6 == kSignedInteger)))) {
          if (local_26c < uVar17) {
            bVar8 = false;
            uVar19 = (uint)bVar3;
            bVar14 = bVar1;
            bVar13 = bVar2;
          }
          else if (uVar16 < local_26c) {
            bVar8 = false;
            uVar19 = uVar15;
            bVar14 = bVar4;
            bVar13 = bVar5;
          }
        }
        if ((bVar8) && (this->rounding_ != false)) {
          if (local_26c == 0) {
            dVar20 = (double)local_26c + -0.5;
          }
          else {
            dVar20 = (double)local_26c + 0.5;
          }
          uVar19 = (uint)dVar20;
          bVar13 = (byte)(uVar19 >> 8);
          bVar14 = (byte)(uVar19 >> 0x10);
        }
        if (!(bool)(bVar8 | this->warning_type_ == kIgnore)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)&local_230,(int)local_278);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"th data is over the range of output type",0x28);
          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"x2x","");
          sptk::PrintErrorMessage(&local_260,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p);
          }
          WVar7 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          iVar18 = 1;
          if (WVar7 == kExit) goto LAB_00136c05;
        }
        if (this->is_ascii_output_ == true) {
          local_27d.value[0] = (uint8_t)uVar19;
          local_27d.value[1] = bVar13;
          local_27d.value[2] = bVar14;
          bVar8 = sptk::SnPrintf<sptk::uint24_t>(&local_27d,local_240,0x80,local_b8);
          iVar18 = 1;
          if (bVar8) {
            sVar12 = strlen(local_b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,local_b8,sVar12);
            if (((int)local_278 + 1) % this->num_column_ == 0) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
              std::ostream::put(-0x78);
              std::ostream::flush();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
            }
LAB_00136c02:
            iVar18 = 0;
          }
        }
        else {
          local_280.value[0] = (uint8_t)uVar19;
          local_280.value[1] = bVar13;
          local_280.value[2] = bVar14;
          bVar8 = sptk::WriteStream<sptk::uint24_t>(&local_280,(ostream *)&std::cout);
          iVar18 = 1;
          if (bVar8) goto LAB_00136c02;
        }
      }
    }
    else {
      bVar8 = sptk::ReadStream<unsigned_int>(&local_26c,local_268);
      iVar18 = 2;
      if (bVar8) goto LAB_00136991;
    }
LAB_00136c05:
    if (iVar18 != 0) {
      if (iVar18 == 2) {
        bVar8 = true;
        if ((this->is_ascii_output_ == true) &&
           ((int)((long)((ulong)(uint)((int)local_278 >> 0x1f) << 0x20 | local_278 & 0xffffffff) %
                 (long)this->num_column_) != 0)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
      }
      else {
        bVar8 = false;
      }
      return bVar8;
    }
    local_278 = (ulong)((int)local_278 + 1);
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }